

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O1

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::internal::assign_op<double,double>>
               (Matrix<double,__1,__1,_0,__1,__1> *dst,
               CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
               *src,assign_op<double,_double> *func)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined8 *puVar4;
  double *pdVar5;
  ulong uVar6;
  Index row;
  ulong uVar7;
  uint uVar8;
  
  uVar1 = (src->m_rows).m_value;
  uVar6 = (src->m_cols).m_value;
  if (((dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows !=
       uVar1) ||
     ((dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols !=
      uVar6)) {
    if ((long)(uVar6 | uVar1) < 0) {
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/PlainObjectBase.h"
                    ,0x115,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                   );
    }
    if ((uVar6 != 0 && uVar1 != 0) &&
       (auVar3 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
       SUB168(auVar3 / SEXT816((long)uVar6),0) < (long)uVar1)) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(8,src,SUB168(auVar3 % SEXT816((long)uVar6),0))
      ;
      *puVar4 = std::random_device::_M_fini;
      __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)dst,uVar6 * uVar1,uVar1,uVar6);
  }
  uVar2 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  if ((uVar2 == uVar1) &&
     (uVar1 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_cols, uVar1 == uVar6)) {
    if (0 < (long)uVar1) {
      pdVar5 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_data;
      uVar6 = 0;
      do {
        if (0 < (long)uVar2) {
          uVar7 = 0;
          do {
            uVar8 = 0x3ff00000;
            if (uVar6 != uVar7) {
              uVar8 = 0;
            }
            pdVar5[uVar7] = (double)((ulong)uVar8 << 0x20);
            uVar7 = uVar7 + 1;
          } while (uVar2 != uVar7);
        }
        uVar6 = uVar6 + 1;
        pdVar5 = pdVar5 + uVar2;
      } while (uVar6 != uVar1);
    }
    return;
  }
  __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/AssignEvaluator.h"
                ,0x2fd,
                "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1>, SrcXprType = Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>, Eigen::Matrix<double, -1, -1>>, T1 = double, T2 = double]"
               );
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);

  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}